

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::ToPropertyDescriptorForProxyObjects
               (Var propertySpec,PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  Type TVar3;
  BOOL BVar4;
  RecyclableObject *pRVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  PropertyRecord *pPVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  PropertyId propertyId;
  char *pcVar11;
  Type *pTVar12;
  bool bVar13;
  Type local_38;
  Var value;
  
  BVar4 = IsObject(propertySpec);
  if (BVar4 == 0) {
    return 0;
  }
  pRVar5 = VarTo<Js::RecyclableObject>(propertySpec);
  BVar4 = HasProperty(pRVar5,0x194);
  if (BVar4 == 1) {
    bVar13 = false;
    BVar4 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x194,&local_38.ptr,scriptContext,
                       (PropertyValueInfo *)0x0);
    if (BVar4 != 0) {
      BVar4 = JavascriptConversion::ToBoolean(local_38.ptr,scriptContext);
      bVar13 = BVar4 != 0;
    }
    PropertyDescriptor::SetEnumerable(descriptor,bVar13);
  }
  BVar4 = HasProperty(pRVar5,0x195);
  if (BVar4 == 1) {
    bVar13 = false;
    BVar4 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x195,&local_38.ptr,scriptContext,
                       (PropertyValueInfo *)0x0);
    if (BVar4 != 0) {
      BVar4 = JavascriptConversion::ToBoolean(local_38.ptr,scriptContext);
      bVar13 = BVar4 != 0;
    }
    PropertyDescriptor::SetConfigurable(descriptor,bVar13);
  }
  BVar4 = HasProperty(pRVar5,0x197);
  if (BVar4 == 1) {
    pTVar12 = &local_38;
    BVar4 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x197,&pTVar12->ptr,scriptContext,
                       (PropertyValueInfo *)0x0);
    if (BVar4 == 0) {
      pTVar12 = &(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue;
    }
    PropertyDescriptor::SetValue(descriptor,pTVar12->ptr);
  }
  BVar4 = HasProperty(pRVar5,0x196);
  if (BVar4 == 1) {
    bVar13 = false;
    BVar4 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x196,&local_38.ptr,scriptContext,
                       (PropertyValueInfo *)0x0);
    if (BVar4 != 0) {
      BVar4 = JavascriptConversion::ToBoolean(local_38.ptr,scriptContext);
      bVar13 = BVar4 != 0;
    }
    PropertyDescriptor::SetWritable(descriptor,bVar13);
  }
  BVar4 = HasProperty(pRVar5,0x198);
  if (BVar4 == 1) {
    pTVar12 = &local_38;
    BVar4 = GetProperty_Internal<false>
                      (pRVar5,pRVar5,false,0x198,&pTVar12->ptr,scriptContext,
                       (PropertyValueInfo *)0x0);
    TVar3.ptr = local_38.ptr;
    if (BVar4 == 0) {
      pTVar12 = &(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue;
    }
    else {
      if (local_38.ptr == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                     ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar13) goto LAB_00abce10;
        *puVar6 = 0;
LAB_00abcac6:
        this = UnsafeVarTo<Js::RecyclableObject>(TVar3.ptr);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                       ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar13) goto LAB_00abce10;
          *puVar6 = 0;
        }
        TVar1 = ((this->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_Undefined) goto LAB_00abcbb7;
        }
        else {
          BVar4 = RecyclableObject::IsExternal(this);
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar6 = 1;
            pcVar11 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
            ;
            pcVar9 = "(typeId < TypeIds_Limit || obj->IsExternal())";
            pcVar8 = "GetTypeId aValue has invalid TypeId";
            uVar10 = 0xe;
            goto LAB_00abcb8d;
          }
        }
      }
      else if (((ulong)local_38.ptr & 0x1ffff00000000) == 0x1000000000000 ||
               ((ulong)local_38.ptr & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)local_38.ptr >> 0x32 == 0 &&
            ((ulong)local_38.ptr & 0xffff000000000000) != 0x1000000000000) goto LAB_00abcac6;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        pcVar11 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
        ;
        pcVar9 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
        pcVar8 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
        uVar10 = 0x2a;
LAB_00abcb8d:
        bVar13 = Throw::ReportAssert(pcVar11,uVar10,pcVar9,pcVar8);
        if (!bVar13) goto LAB_00abce10;
        *puVar6 = 0;
      }
      bVar13 = JavascriptConversion::IsCallable(local_38.ptr);
      if (!bVar13) {
        propertyId = 0x198;
        goto LAB_00abce24;
      }
    }
LAB_00abcbb7:
    PropertyDescriptor::SetGetter(descriptor,pTVar12->ptr);
  }
  BVar4 = HasProperty(pRVar5,0x19b);
  if (BVar4 != 1) {
    return 1;
  }
  pTVar12 = &local_38;
  BVar4 = GetProperty_Internal<false>
                    (pRVar5,pRVar5,false,0x19b,&pTVar12->ptr,scriptContext,(PropertyValueInfo *)0x0)
  ;
  TVar3.ptr = local_38.ptr;
  if (BVar4 == 0) {
    pTVar12 = &(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue;
    goto LAB_00abcdf0;
  }
  if (local_38.ptr == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                 ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar13) goto LAB_00abce10;
    *puVar6 = 0;
LAB_00abcd10:
    pRVar5 = UnsafeVarTo<Js::RecyclableObject>(TVar3.ptr);
    if (pRVar5 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                   ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar13) goto LAB_00abce10;
      *puVar6 = 0;
    }
    TVar1 = ((pRVar5->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_Undefined) goto LAB_00abcdf0;
    }
    else {
      BVar4 = RecyclableObject::IsExternal(pRVar5);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        pcVar11 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        pcVar9 = "(typeId < TypeIds_Limit || obj->IsExternal())";
        pcVar8 = "GetTypeId aValue has invalid TypeId";
        uVar10 = 0xe;
        goto LAB_00abcdd3;
      }
    }
  }
  else if (((ulong)local_38.ptr & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)local_38.ptr & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)local_38.ptr >> 0x32 == 0 &&
        ((ulong)local_38.ptr & 0xffff000000000000) != 0x1000000000000) goto LAB_00abcd10;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    pcVar11 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    pcVar9 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar8 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar10 = 0x2a;
LAB_00abcdd3:
    bVar13 = Throw::ReportAssert(pcVar11,uVar10,pcVar9,pcVar8);
    if (!bVar13) {
LAB_00abce10:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar13 = JavascriptConversion::IsCallable(local_38.ptr);
  if (!bVar13) {
    propertyId = 0x19b;
LAB_00abce24:
    pPVar7 = ScriptContext::GetPropertyName(scriptContext,propertyId);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,(PCWSTR)(pPVar7 + 1));
  }
LAB_00abcdf0:
  PropertyDescriptor::SetSetter(descriptor,pTVar12->ptr);
  return 1;
}

Assistant:

BOOL JavascriptOperators::ToPropertyDescriptorForProxyObjects(Var propertySpec, PropertyDescriptor* descriptor, ScriptContext* scriptContext)
    {
        if (!JavascriptOperators::IsObject(propertySpec))
        {
            return FALSE;
        }

        Var value;
        RecyclableObject* propertySpecObj = VarTo<RecyclableObject>(propertySpec);

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::enumerable) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::enumerable, &value, scriptContext))
            {
                descriptor->SetEnumerable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetEnumerable(false);
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::configurable) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::configurable, &value, scriptContext))
            {
                descriptor->SetConfigurable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetConfigurable(false);
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::value) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::value, &value, scriptContext))
            {
                descriptor->SetValue(value);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetValue(scriptContext->GetLibrary()->GetUndefined());
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::writable) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::writable, &value, scriptContext))
            {
                descriptor->SetWritable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetWritable(false);
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::get) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::get, &value, scriptContext))
            {
                if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::get)->GetBuffer());
                }
                descriptor->SetGetter(value);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetGetter(scriptContext->GetLibrary()->GetUndefined());
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::set) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::set, &value, scriptContext))
            {
                if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::set)->GetBuffer());
                }
                descriptor->SetSetter(value);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetSetter(scriptContext->GetLibrary()->GetUndefined());
            }
        }

        return TRUE;
    }